

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O3

UBool icu_63::ValueComparator(UHashTok val1,UHashTok val2)

{
  ushort uVar1;
  short sVar2;
  byte bVar3;
  UBool UVar4;
  int len;
  UnicodeString *affix_2;
  UnicodeString *affix_1;
  int iVar5;
  
  uVar1 = *(ushort *)((long)val1.pointer + 8);
  if ((uVar1 & 1) == 0) {
    if ((short)uVar1 < 0) {
      len = *(int *)((long)val1.pointer + 0xc);
    }
    else {
      len = (int)(short)uVar1 >> 5;
    }
    sVar2 = *(short *)((long)val2.pointer + 8);
    if (sVar2 < 0) {
      iVar5 = *(int *)((long)val2.pointer + 0xc);
    }
    else {
      iVar5 = (int)sVar2 >> 5;
    }
    bVar3 = 0;
    if ((((int)sVar2 & 1U) == 0) && (len == iVar5)) {
      UVar4 = UnicodeString::doEquals
                        ((UnicodeString *)val1.pointer,(UnicodeString *)val2.pointer,len);
      return UVar4 != '\0';
    }
  }
  else {
    bVar3 = *(byte *)((long)val2.pointer + 8) & 1;
  }
  return bVar3;
}

Assistant:

inline UBool
UnicodeString::isBogus() const
{ return (UBool)(fUnion.fFields.fLengthAndFlags & kIsBogus); }